

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint128_c_t farmhash128_cc_city(char *s,size_t len)

{
  uint64_t lo;
  uint64_t uVar1;
  ulong in_RSI;
  char *in_RDI;
  size_t in_stack_000000b8;
  char *in_stack_000000c0;
  undefined1 in_stack_000000c8 [16];
  uint128_c_t local_10;
  
  if (in_RSI < 0x10) {
    make_uint128_c_t(0xc3a5c85c97cb3127,0xb492b66fbe98f273);
    local_10 = farmhash128_cc_city_with_seed
                         (in_stack_000000c0,in_stack_000000b8,(uint128_c_t)in_stack_000000c8);
  }
  else {
    lo = fetch64(in_RDI);
    uVar1 = fetch64(in_RDI + 8);
    make_uint128_c_t(lo,uVar1 + 0xc3a5c85c97cb3127);
    local_10 = farmhash128_cc_city_with_seed
                         (in_stack_000000c0,in_stack_000000b8,(uint128_c_t)in_stack_000000c8);
  }
  return local_10;
}

Assistant:

static inline uint128_c_t farmhash128_cc_city(const char *s, size_t len) {
  return len >= 16 ?
      farmhash128_cc_city_with_seed(s + 16, len - 16,
                          make_uint128_c_t(fetch64(s), fetch64(s + 8) + k0)) :
      farmhash128_cc_city_with_seed(s, len, make_uint128_c_t(k0, k1));
}